

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O1

void strprepProfileLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  int32_t length;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  UStringPrepType type;
  int iVar6;
  uint32_t rangeEnd;
  uint32_t rangeStart;
  char *end;
  uint32_t mapping [40];
  uint8_t auStack_104 [4];
  UErrorCode *pUStack_100;
  uint32_t local_f0;
  uint32_t local_ec;
  ulong local_e8;
  char *local_e0;
  uint32_t local_d8 [42];
  
  local_ec = 0;
  local_f0 = 0;
  pUStack_100 = (UErrorCode *)0x109ed6;
  pcVar3 = u_skipWhitespace((*fields)[0]);
  if (*pcVar3 == '@') {
    pcVar3 = pcVar3 + 1;
    iVar6 = *(int *)(*fields + 1) - (int)pcVar3;
    if (8 < iVar6) {
      pUStack_100 = (UErrorCode *)0x109f01;
      iVar2 = strncmp(pcVar3,"normalize",9);
      if (iVar2 == 0) {
        options[8].doesOccur = '\x01';
        return;
      }
    }
    if (9 < iVar6) {
      pUStack_100 = (UErrorCode *)0x109f1e;
      iVar6 = strncmp(pcVar3,"check-bidi",10);
      if (iVar6 == 0) {
        options[10].doesOccur = '\x01';
        return;
      }
    }
    pUStack_100 = (UErrorCode *)0x109f42;
    strprepProfileLineFn_cold_1();
  }
  pcVar1 = fields[1][0];
  pcVar5 = fields[2][0];
  pUStack_100 = (UErrorCode *)0x109f59;
  pcVar4 = strstr(pcVar5,"UNASSIGNED");
  if (pcVar4 == (char *)0x0) {
    pUStack_100 = (UErrorCode *)0x109f98;
    pcVar4 = strstr(pcVar5,"PROHIBITED");
    if (pcVar4 == (char *)0x0) {
      pUStack_100 = (UErrorCode *)0x109ffc;
      pcVar5 = strstr(pcVar5,"MAP");
      if (pcVar5 == (char *)0x0) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
      }
      else {
        pUStack_100 = (UErrorCode *)0x10a016;
        local_e8 = strtoul(pcVar3,&local_e0,0x10);
        if ((local_e0 <= pcVar3) || (local_e0 != (*fields)[1])) {
          pUStack_100 = (UErrorCode *)0x10a0ca;
          strprepProfileLineFn_cold_4();
          pUStack_100 = pErrorCode;
          u_versionFromString_63(auStack_104,(char *)fields);
          dataInfo.dataVersion[0] = auStack_104[0];
          dataInfo.dataVersion[1] = auStack_104[1];
          dataInfo.dataVersion[2] = auStack_104[2];
          dataInfo.dataVersion[3] = auStack_104[3];
          return;
        }
        pUStack_100 = (UErrorCode *)0x10a04a;
        length = u_parseCodePoints(pcVar1,local_d8,0x28,pErrorCode);
        pUStack_100 = (UErrorCode *)0x10a061;
        storeMapping((uint32_t)local_e8,local_d8,length,USPREP_MAP,pErrorCode);
      }
      goto LAB_00109fd1;
    }
    pUStack_100 = (UErrorCode *)0x109fb2;
    u_parseCodePointRange(pcVar3,&local_ec,&local_f0,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      pUStack_100 = (UErrorCode *)0x10a080;
      strprepProfileLineFn_cold_3();
      return;
    }
    type = USPREP_PROHIBITED;
  }
  else {
    pUStack_100 = (UErrorCode *)0x109f73;
    u_parseCodePointRange(pcVar3,&local_ec,&local_f0,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      pUStack_100 = (UErrorCode *)0x10a076;
      strprepProfileLineFn_cold_2();
      return;
    }
    type = USPREP_UNASSIGNED;
  }
  pUStack_100 = (UErrorCode *)0x109fd1;
  storeRange(local_ec,local_f0,type,pErrorCode);
LAB_00109fd1:
  __stream = _stderr;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  pcVar3 = (*fields)[0];
  pcVar1 = fields[2][0];
  pUStack_100 = (UErrorCode *)0x10a09b;
  pcVar5 = u_errorName_63(*pErrorCode);
  pUStack_100 = (UErrorCode *)0x10a0b8;
  fprintf(__stream,"gensprep error parsing  %s line %s at %s. Error: %s\n",context,pcVar3,pcVar1,
          pcVar5);
  pUStack_100 = (UErrorCode *)0x10a0bf;
  exit(*pErrorCode);
}

Assistant:

static void U_CALLCONV
strprepProfileLineFn(void *context,
              char *fields[][2], int32_t fieldCount,
              UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *map;
    uint32_t code;
    int32_t length;
   /*UBool* mapWithNorm = (UBool*) context;*/
    const char* typeName;
    uint32_t rangeStart=0,rangeEnd =0;
    const char* filename = (const char*) context;
    const char *s;

    s = u_skipWhitespace(fields[0][0]);
    if (*s == '@') {
        /* special directive */
        s++;
        length = (int32_t)(fields[0][1] - s);
        if (length >= NORMALIZE_DIRECTIVE_LEN
            && uprv_strncmp(s, NORMALIZE_DIRECTIVE, NORMALIZE_DIRECTIVE_LEN) == 0) {
            options[NORMALIZE].doesOccur = TRUE;
            return;
        }
        else if (length >= CHECK_BIDI_DIRECTIVE_LEN
            && uprv_strncmp(s, CHECK_BIDI_DIRECTIVE, CHECK_BIDI_DIRECTIVE_LEN) == 0) {
            options[CHECK_BIDI].doesOccur = TRUE;
            return;
        }
        else {
            fprintf(stderr, "gensprep error parsing a directive %s.", fields[0][0]);
        }
    }

    typeName = fields[2][0];
    map = fields[1][0];

    if(uprv_strstr(typeName, usprepTypeNames[USPREP_UNASSIGNED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_UNASSIGNED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_PROHIBITED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_PROHIBITED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_MAP])!=NULL){

        /* get the character code, field 0 */
        code=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || end!=fields[0][1]) {
            fprintf(stderr, "gensprep: syntax error in field 0 at %s\n", fields[0][0]);
            *pErrorCode=U_PARSE_ERROR;
            exit(U_PARSE_ERROR);
        }

        /* parse the mapping string */
        length=u_parseCodePoints(map, mapping, sizeof(mapping)/4, pErrorCode);
        
        /* store the mapping */
        storeMapping(code,mapping, length,USPREP_MAP, pErrorCode);

    }else{
        *pErrorCode = U_INVALID_FORMAT_ERROR;
    }
    
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing  %s line %s at %s. Error: %s\n",filename,
               fields[0][0],fields[2][0],u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

}